

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O3

void do_mon_spell(wchar_t index,monster_conflict *mon,_Bool seen)

{
  monster_spell_level *pmVar1;
  player *p;
  _Bool hits;
  wchar_t wVar2;
  wchar_t wVar3;
  monster *pmVar4;
  monster_spell_level *pmVar5;
  monster_spell **spell;
  effect *peVar6;
  source sVar7;
  source origin;
  _Bool ident;
  
  p = player;
  spell = &monster_spells;
  do {
    spell = &((monster_spell *)spell)->next->next;
    if ((monster_spell *)spell == (monster_spell *)0x0) break;
  } while ((uint)((monster_spell *)spell)->index != index);
  ident = false;
  wVar3 = (mon->target).midx;
  wVar2 = ((monster_spell *)spell)->hit;
  if (wVar2 == L'd') {
    disturb(player);
    spell_message(mon,(monster_spell *)spell,seen,true);
  }
  else {
    if (wVar2 == L'\0') {
      disturb(player);
      spell_message(mon,(monster_spell *)spell,seen,false);
      return;
    }
    if (wVar3 < L'\x01') {
      wVar2 = chance_of_spell_hit(mon,(monster_spell *)(ulong)(uint)wVar2);
      hits = check_hit(p,wVar2);
    }
    else {
      wVar2 = chance_of_spell_hit(mon,(monster_spell *)(ulong)(uint)wVar2);
      pmVar4 = cave_monster(cave,wVar3);
      hits = test_hit(wVar2,pmVar4->race->ac);
    }
    disturb(player);
    spell_message(mon,(monster_spell *)spell,seen,hits);
    if (hits == false) {
      return;
    }
  }
  pmVar1 = ((monster_spell *)spell)->level;
  do {
    pmVar5 = pmVar1;
    pmVar1 = pmVar5->next;
    if (pmVar1 == (monster_spell_level *)0x0) break;
  } while (pmVar1->power <= mon->race->spell_power);
  if ((wVar3 < L'\x01' && pmVar5->save_message != (char *)0x0) &&
     (wVar3 = Rand_div(100), wVar3 < (player->state).skills[3])) {
    msg("%s",pmVar5->save_message);
    for (peVar6 = ((monster_spell *)spell)->effect; peVar6 != (effect *)0x0; peVar6 = peVar6->next)
    {
      if (peVar6->index == 10) {
        player_inc_check(player,peVar6->subtype,false);
      }
      else if (peVar6->index == 0x3d) {
        equip_learn_element(player,L'\t');
      }
    }
    return;
  }
  peVar6 = ((monster_spell *)spell)->effect;
  sVar7 = source_monster(mon->midx);
  origin.which = sVar7.which;
  origin._4_4_ = 0;
  origin.what = sVar7.what;
  effect_do(peVar6,origin,(object *)0x0,&ident,true,L'\0',L'\0',L'\0',(command *)0x0);
  return;
}

Assistant:

void do_mon_spell(int index, struct monster *mon, bool seen)
{
	const struct monster_spell *spell = monster_spell_by_index(index);

	bool ident = false;
	bool hits;
	int target_midx = mon->target.midx;

	/* See if it hits */
	if (spell->hit == 100) {
		hits = true;
	} else if (spell->hit == 0) {
		hits = false;
	} else {
		if (target_midx > 0) {
			hits = test_hit(chance_of_spell_hit(mon, spell),
				cave_monster(cave, target_midx)->race->ac);
		} else {
			hits = check_hit(player, chance_of_spell_hit(mon, spell));
		}
	}

	/* Tell the player what's going on */
	disturb(player);
	spell_message(mon, spell, seen, hits);

	if (hits) {
		struct monster_spell_level *level = spell->level;

		/* Get the right level of save message */
		while (level->next && mon->race->spell_power >= level->next->power) {
			level = level->next;
		}

		/* Try a saving throw if available */
		if (level->save_message && (target_midx <= 0) &&
				randint0(100) < player->state.skills[SKILL_SAVE]) {
			msg("%s", level->save_message);
			spell_check_for_fail_rune(spell);
		} else {
			effect_do(spell->effect, source_monster(mon->midx), NULL, &ident, true, 0, 0, 0, NULL);
		}
	}
}